

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.cpp
# Opt level: O2

void __thiscall Js::String::Set(String *this,char16 *pszValue)

{
  size_t sVar1;
  size_t sVar2;
  WCHAR *_Dst;
  
  if (this->pszValue != (char16_t *)0x0) {
    sVar1 = PAL_wcslen(this->pszValue);
    Memory::DeleteArray<Memory::NoCheckHeapAllocator,char16_t>
              ((AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,sVar1 + 1,this->pszValue);
  }
  if (pszValue != (char16 *)0x0) {
    sVar2 = PAL_wcslen(pszValue);
    sVar1 = 0xffffffffffffffff;
    if (-1 < (long)(sVar2 + 1)) {
      sVar1 = sVar2 * 2 + 2;
    }
    _Dst = (WCHAR *)Memory::NoCheckHeapAllocator::Alloc
                              ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,sVar1
                              );
    this->pszValue = _Dst;
    wcscpy_s(_Dst,sVar2 + 1,pszValue);
    return;
  }
  this->pszValue = (char16 *)0x0;
  return;
}

Assistant:

void
    String::Set(__in_z_opt const char16* pszValue)
    {
        if(NULL != this->pszValue)
        {
            NoCheckHeapDeleteArray(wcslen(this->pszValue) + 1, this->pszValue);
        }

        if(NULL != pszValue)
        {
            size_t size    = 1 + wcslen(pszValue);
            this->pszValue  = NoCheckHeapNewArray(char16, size);
            wcscpy_s(this->pszValue, size, pszValue);
        }
        else
        {
            this->pszValue = NULL;
        }
    }